

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

raw_problem_status parse(context *ctx,stream_buffer *buf,problem_parser *p)

{
  string_view *psVar1;
  string_view *psVar2;
  char *pcVar3;
  size_t sVar4;
  pointer pvVar5;
  string_view first;
  string_view rhs;
  string_view buf_1;
  string_view buf_1_00;
  string_view str;
  string_view buf_1_01;
  string_view buf_1_02;
  string_view buf_1_03;
  string_view buf_1_04;
  string_view buf_1_05;
  string_view rhs_00;
  string_view buf_1_06;
  string_view rhs_01;
  string_view value_00;
  string_view buf_1_07;
  string_view rhs_02;
  string_view value_01;
  string_view buf_1_08;
  char *pcVar6;
  size_t sVar7;
  char *pcVar8;
  string_view value_02;
  string_view value_03;
  string_view value_04;
  bool bVar9;
  int iVar10;
  uint uVar11;
  optional<baryonyx::objective_function_type> oVar12;
  undefined8 uVar13;
  problem_parser *ppVar14;
  undefined8 uVar15;
  ulong uVar16;
  long lVar17;
  char cVar18;
  ulong uVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  double sign_factor;
  raw_problem_status rVar22;
  optional<operator_token> oVar23;
  raw_problem_status rVar24;
  string_view sVar25;
  string_view rhs_03;
  int value;
  vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_> elements;
  optional<real_token> value_opt;
  value_type tmp;
  uint local_1f8;
  int local_1f4;
  int local_1f0;
  int local_1ec;
  double local_1e8;
  double dStack_1e0;
  basic_string_view<char,_std::char_traits<char>_> *local_1d0;
  basic_string_view<char,_std::char_traits<char>_> *local_1c8;
  basic_string_view<char,_std::char_traits<char>_> *local_1c0;
  basic_string_view<char,_std::char_traits<char>_> *local_1b8;
  basic_string_view<char,_std::char_traits<char>_> *local_1b0;
  basic_string_view<char,_std::char_traits<char>_> *local_1a8;
  basic_string_view<char,_std::char_traits<char>_> *local_1a0;
  basic_string_view<char,_std::char_traits<char>_> *local_198;
  basic_string_view<char,_std::char_traits<char>_> *local_190;
  uint local_184;
  problem_parser *local_180;
  _Storage<bound_token,_true> local_178;
  char local_150;
  basic_string_view<char,_std::char_traits<char>_> local_148;
  _Storage<real_token,_true> local_138;
  char local_128;
  vector<baryonyx::constraint,std::allocator<baryonyx::constraint>> *local_120;
  vector<baryonyx::constraint,std::allocator<baryonyx::constraint>> *local_118;
  vector<baryonyx::constraint,std::allocator<baryonyx::constraint>> *local_110;
  _Storage<function_element_token,_true> local_108;
  size_t sStack_e8;
  char *pcStack_e0;
  size_t sStack_d8;
  char *pcStack_d0;
  size_t sStack_c8;
  char *pcStack_c0;
  size_t sStack_b8;
  char *pcStack_b0;
  size_t local_a8;
  char *pcStack_a0;
  size_t sStack_98;
  char *pcStack_90;
  size_t sStack_88;
  char *pcStack_80;
  size_t sStack_78;
  char *pcStack_70;
  size_t local_60;
  char *pcStack_58;
  size_t local_50;
  char *pcStack_48;
  size_t local_40;
  char *pcStack_38;
  
  sVar25._M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
  sVar25._M_str = (buf->buffer_ptr)._M_elems[0]._M_str;
  oVar12 = read_objective_type(sVar25);
  if (((ulong)oVar12.super__Optional_base<baryonyx::objective_function_type,_true,_true>._M_payload.
              super__Optional_payload_base<baryonyx::objective_function_type> >> 0x20 & 1) != 0) {
    (p->m_problem).type =
         oVar12.super__Optional_base<baryonyx::objective_function_type,_true,_true>._M_payload.
         super__Optional_payload_base<baryonyx::objective_function_type>._M_payload;
    local_108._M_value.factor = (double)(buf->buffer_ptr)._M_elems[0]._M_len;
    local_108._M_value.name._M_len = (size_t)(buf->buffer_ptr)._M_elems[0]._M_str;
    pcVar3 = (buf->buffer_ptr)._M_elems[1]._M_str;
    sVar4 = (buf->buffer_ptr)._M_elems[2]._M_len;
    pcVar6 = (buf->buffer_ptr)._M_elems[2]._M_str;
    sVar7 = (buf->buffer_ptr)._M_elems[3]._M_len;
    pcVar8 = (buf->buffer_ptr)._M_elems[3]._M_str;
    (buf->buffer_ptr)._M_elems[0]._M_len = (buf->buffer_ptr)._M_elems[1]._M_len;
    (buf->buffer_ptr)._M_elems[0]._M_str = pcVar3;
    (buf->buffer_ptr)._M_elems[1]._M_len = sVar4;
    (buf->buffer_ptr)._M_elems[1]._M_str = pcVar6;
    (buf->buffer_ptr)._M_elems[2]._M_len = sVar7;
    (buf->buffer_ptr)._M_elems[2]._M_str = pcVar8;
    pcVar3 = (buf->buffer_ptr)._M_elems[4]._M_str;
    sVar4 = (buf->buffer_ptr)._M_elems[5]._M_len;
    pcVar6 = (buf->buffer_ptr)._M_elems[5]._M_str;
    (buf->buffer_ptr)._M_elems[3]._M_len = (buf->buffer_ptr)._M_elems[4]._M_len;
    (buf->buffer_ptr)._M_elems[3]._M_str = pcVar3;
    (buf->buffer_ptr)._M_elems[4]._M_len = sVar4;
    (buf->buffer_ptr)._M_elems[4]._M_str = pcVar6;
    pcVar3 = (buf->buffer_ptr)._M_elems[6]._M_str;
    sVar4 = (buf->buffer_ptr)._M_elems[7]._M_len;
    pcVar6 = (buf->buffer_ptr)._M_elems[7]._M_str;
    (buf->buffer_ptr)._M_elems[5]._M_len = (buf->buffer_ptr)._M_elems[6]._M_len;
    (buf->buffer_ptr)._M_elems[5]._M_str = pcVar3;
    (buf->buffer_ptr)._M_elems[6]._M_len = sVar4;
    (buf->buffer_ptr)._M_elems[6]._M_str = pcVar6;
    pcVar3 = (buf->buffer_ptr)._M_elems[8]._M_str;
    (buf->buffer_ptr)._M_elems[7]._M_len = (buf->buffer_ptr)._M_elems[8]._M_len;
    (buf->buffer_ptr)._M_elems[7]._M_str = pcVar3;
    pcVar3 = (buf->buffer_ptr)._M_elems[9]._M_str;
    (buf->buffer_ptr)._M_elems[8]._M_len = (buf->buffer_ptr)._M_elems[9]._M_len;
    (buf->buffer_ptr)._M_elems[8]._M_str = pcVar3;
    (buf->buffer_ptr)._M_elems[9]._M_len = (size_t)local_108._M_value.factor;
    (buf->buffer_ptr)._M_elems[9]._M_str = (char *)local_108._M_value.name._M_len;
    sVar25 = stream_buffer::next_token(buf);
    (buf->buffer_ptr)._M_elems[9] = sVar25;
    first._M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
    first._M_str = (buf->buffer_ptr)._M_elems[0]._M_str;
    iVar10 = try_read_objective_label(first,(buf->buffer_ptr)._M_elems[1]);
    if (iVar10 != 0) {
      stream_buffer::pop_front(buf,iVar10);
    }
    local_198 = (buf->buffer_ptr)._M_elems + 2;
    local_1a0 = (buf->buffer_ptr)._M_elems + 3;
    local_190 = (buf->buffer_ptr)._M_elems + 1;
    local_1e8 = 0.0;
    local_184 = 5;
    local_1f8 = 0;
    local_1a8 = (buf->buffer_ptr)._M_elems + 4;
    local_1b0 = (buf->buffer_ptr)._M_elems + 5;
    local_1b8 = (buf->buffer_ptr)._M_elems + 6;
    local_1c0 = (buf->buffer_ptr)._M_elems + 7;
    local_1c8 = (buf->buffer_ptr)._M_elems + 8;
    local_1d0 = (buf->buffer_ptr)._M_elems + 9;
    local_180 = p;
LAB_001348a8:
    do {
      rhs._M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
      rhs._M_str = (buf->buffer_ptr)._M_elems[0]._M_str;
      lVar17 = 8;
      do {
        bVar9 = are_equal(*(string_view *)((long)&PTR_typeinfo_0079c9d8 + lVar17),rhs);
        ppVar14 = local_180;
        if (bVar9) break;
        bVar20 = lVar17 != 0xd8;
        lVar17 = lVar17 + 0x10;
      } while (bVar20);
      pcVar3 = (buf->buffer_ptr)._M_elems[0]._M_str;
      buf_1_00._M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
      buf_1_00._M_str = (buf->buffer_ptr)._M_elems[0]._M_str;
      buf_1._M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
      buf_1._M_str = (buf->buffer_ptr)._M_elems[0]._M_str;
      psVar1 = (buf->buffer_ptr)._M_elems + 1;
      if (bVar9) {
        iVar10 = read_subject_to(buf_1_00,*psVar1,(buf->buffer_ptr)._M_elems[2]);
        if (iVar10 == 0) goto LAB_00135246;
        stream_buffer::pop_front(buf,iVar10);
        local_110 = (vector<baryonyx::constraint,std::allocator<baryonyx::constraint>> *)
                    &(ppVar14->m_problem).less_constraints;
        local_118 = (vector<baryonyx::constraint,std::allocator<baryonyx::constraint>> *)
                    &(ppVar14->m_problem).greater_constraints;
        local_120 = (vector<baryonyx::constraint,std::allocator<baryonyx::constraint>> *)
                    &(ppVar14->m_problem).equal_constraints;
        local_1f0 = 0;
        uVar19 = (ulong)local_184;
        goto LAB_00134baa;
      }
      if ((buf->buffer_ptr)._M_elems[0]._M_len != 1) {
LAB_0013493d:
        psVar2 = (buf->buffer_ptr)._M_elems + 2;
        local_40 = psVar2->_M_len;
        pcStack_38 = (buf->buffer_ptr)._M_elems[2]._M_str;
        read_function_element
                  ((optional<function_element_token> *)&local_108._M_value,buf_1,*psVar1,*psVar2);
        if ((char)sStack_e8 != '\x01') {
          local_1e8 = 0.0;
          uVar19 = 6;
          goto LAB_00135680;
        }
        bVar9 = problem_parser::append_to_objective(ppVar14,&local_108._M_value);
        if (!bVar9) {
          local_1e8 = 0.0;
          uVar19 = 0xb;
          goto LAB_00135680;
        }
        stream_buffer::pop_front(buf,local_108._M_value.read);
        goto LAB_001348a8;
      }
      cVar18 = *pcVar3;
      if (cVar18 == '[') {
LAB_00134b0a:
        sign_factor = 1.0;
      }
      else {
        if (((psVar1->_M_len != 1 || cVar18 != '+') && (cVar18 != '-' || psVar1->_M_len != 1)) ||
           (*(buf->buffer_ptr)._M_elems[1]._M_str != '[')) goto LAB_0013493d;
        cVar18 = *pcVar3;
        if (cVar18 == '+') {
          local_108._M_value.factor = (double)(buf->buffer_ptr)._M_elems[0]._M_len;
          local_108._M_value.name._M_len = (size_t)(buf->buffer_ptr)._M_elems[0]._M_str;
          pcVar3 = local_190->_M_str;
          (buf->buffer_ptr)._M_elems[0]._M_len = local_190->_M_len;
          (buf->buffer_ptr)._M_elems[0]._M_str = pcVar3;
          pcVar3 = local_198->_M_str;
          local_190->_M_len = local_198->_M_len;
          local_190->_M_str = pcVar3;
          pcVar3 = local_1a0->_M_str;
          local_198->_M_len = local_1a0->_M_len;
          local_198->_M_str = pcVar3;
          pcVar3 = local_1a8->_M_str;
          local_1a0->_M_len = local_1a8->_M_len;
          local_1a0->_M_str = pcVar3;
          pcVar3 = local_1b0->_M_str;
          local_1a8->_M_len = local_1b0->_M_len;
          local_1a8->_M_str = pcVar3;
          pcVar3 = local_1b8->_M_str;
          local_1b0->_M_len = local_1b8->_M_len;
          local_1b0->_M_str = pcVar3;
          pcVar3 = local_1c0->_M_str;
          local_1b8->_M_len = local_1c0->_M_len;
          local_1b8->_M_str = pcVar3;
          pcVar3 = local_1c8->_M_str;
          local_1c0->_M_len = local_1c8->_M_len;
          local_1c0->_M_str = pcVar3;
          pcVar3 = local_1d0->_M_str;
          local_1c8->_M_len = local_1d0->_M_len;
          local_1c8->_M_str = pcVar3;
          local_1d0->_M_len = (size_t)local_108._M_value.factor;
          local_1d0->_M_str = (char *)local_108._M_value.name._M_len;
          sVar25 = stream_buffer::next_token(buf);
          (buf->buffer_ptr)._M_elems[9] = sVar25;
          goto LAB_00134b0a;
        }
        sign_factor = 1.0;
        if (cVar18 == '-') {
          local_108._M_value.factor = (double)(buf->buffer_ptr)._M_elems[0]._M_len;
          local_108._M_value.name._M_len = (size_t)(buf->buffer_ptr)._M_elems[0]._M_str;
          pcVar3 = local_190->_M_str;
          (buf->buffer_ptr)._M_elems[0]._M_len = local_190->_M_len;
          (buf->buffer_ptr)._M_elems[0]._M_str = pcVar3;
          pcVar3 = local_198->_M_str;
          local_190->_M_len = local_198->_M_len;
          local_190->_M_str = pcVar3;
          pcVar3 = local_1a0->_M_str;
          local_198->_M_len = local_1a0->_M_len;
          local_198->_M_str = pcVar3;
          pcVar3 = local_1a8->_M_str;
          local_1a0->_M_len = local_1a8->_M_len;
          local_1a0->_M_str = pcVar3;
          pcVar3 = local_1b0->_M_str;
          local_1a8->_M_len = local_1b0->_M_len;
          local_1a8->_M_str = pcVar3;
          pcVar3 = local_1b8->_M_str;
          local_1b0->_M_len = local_1b8->_M_len;
          local_1b0->_M_str = pcVar3;
          pcVar3 = local_1c0->_M_str;
          local_1b8->_M_len = local_1c0->_M_len;
          local_1b8->_M_str = pcVar3;
          pcVar3 = local_1c8->_M_str;
          local_1c0->_M_len = local_1c8->_M_len;
          local_1c0->_M_str = pcVar3;
          pcVar3 = local_1d0->_M_str;
          local_1c8->_M_len = local_1d0->_M_len;
          local_1c8->_M_str = pcVar3;
          local_1d0->_M_len = (size_t)local_108._M_value.factor;
          local_1d0->_M_str = (char *)local_108._M_value.name._M_len;
          sVar25 = stream_buffer::next_token(buf);
          sign_factor = -1.0;
          (buf->buffer_ptr)._M_elems[9] = sVar25;
        }
      }
      rVar22 = read_quadratic_element(buf,ppVar14,sign_factor);
      local_1f8 = rVar22.column;
      local_1e8 = (double)(rVar22._0_8_ >> 0x20);
      local_184 = 0;
    } while (rVar22.tag == success);
    goto LAB_00135688;
  }
  local_1e8 = 0.0;
  uVar19 = 5;
  goto LAB_00135680;
LAB_00134baa:
  do {
    sVar4 = (buf->buffer_ptr)._M_elems[0]._M_len;
    if (sVar4 == 0) {
LAB_001351e6:
      if ((ulong)(((long)(ppVar14->m_problem).less_constraints.
                         super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(ppVar14->m_problem).less_constraints.
                         super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555 +
                 ((long)(ppVar14->m_problem).greater_constraints.
                        super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(ppVar14->m_problem).greater_constraints.
                        super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555 +
                 ((long)(ppVar14->m_problem).equal_constraints.
                        super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(ppVar14->m_problem).equal_constraints.
                        super__Vector_base<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555) <
          0x80000000) goto LAB_00135246;
      local_1e8 = 0.0;
      uVar19 = 0xc;
      goto LAB_00135680;
    }
    pcVar3 = (buf->buffer_ptr)._M_elems[0]._M_str;
    lVar17 = 8;
    do {
      rhs_03._M_str = pcVar3;
      rhs_03._M_len = sVar4;
      bVar9 = are_equal(*(string_view *)((long)&PTR_typeinfo_0079c9d8 + lVar17),rhs_03);
      ppVar14 = local_180;
      if (bVar9) break;
      bVar20 = lVar17 != 0xd8;
      lVar17 = lVar17 + 0x10;
    } while (bVar20);
    if (bVar9) goto LAB_001351e6;
    local_178._M_value.name._M_len = 0;
    local_148._M_len = 0;
    local_148._M_str = (char *)0x0;
    local_178._0_16_ = (undefined1  [16])0x0;
    if (((((buf->buffer_ptr)._M_elems[0]._M_len != 0) &&
         (bVar9 = is_char_name((int)*(buf->buffer_ptr)._M_elems[0]._M_str), bVar9)) &&
        ((buf->buffer_ptr)._M_elems[1]._M_len == 1)) &&
       (*(buf->buffer_ptr)._M_elems[1]._M_str == ':')) {
      str._M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
      str._M_str = (buf->buffer_ptr)._M_elems[0]._M_str;
      local_148 = baryonyx::string_buffer::append
                            ((ppVar14->m_problem).strings.
                             super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr,str);
      lVar17 = 0x88;
      local_108._M_value.factor = (double)(buf->buffer_ptr)._M_elems[0]._M_len;
      local_108._M_value.name._M_len = (size_t)(buf->buffer_ptr)._M_elems[0]._M_str;
      pcVar3 = local_198->_M_str;
      (buf->buffer_ptr)._M_elems[0]._M_len = local_198->_M_len;
      (buf->buffer_ptr)._M_elems[0]._M_str = pcVar3;
      pcVar3 = local_1a0->_M_str;
      local_190->_M_len = local_1a0->_M_len;
      local_190->_M_str = pcVar3;
      pcVar3 = local_1a8->_M_str;
      local_198->_M_len = local_1a8->_M_len;
      local_198->_M_str = pcVar3;
      pcVar3 = local_1b0->_M_str;
      local_1a0->_M_len = local_1b0->_M_len;
      local_1a0->_M_str = pcVar3;
      pcVar3 = local_1b8->_M_str;
      local_1a8->_M_len = local_1b8->_M_len;
      local_1a8->_M_str = pcVar3;
      pcVar3 = local_1c0->_M_str;
      local_1b0->_M_len = local_1c0->_M_len;
      local_1b0->_M_str = pcVar3;
      pcVar3 = local_1c8->_M_str;
      local_1b8->_M_len = local_1c8->_M_len;
      local_1b8->_M_str = pcVar3;
      pcVar3 = local_1d0->_M_str;
      local_1c0->_M_len = local_1d0->_M_len;
      local_1c0->_M_str = pcVar3;
      pcVar3 = (buf->buffer_ptr)._M_elems[0]._M_str;
      local_1c8->_M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
      local_1c8->_M_str = pcVar3;
      local_1d0->_M_len = (size_t)local_108._M_value.factor;
      local_1d0->_M_str = (char *)local_108._M_value.name._M_len;
      do {
        sVar25 = stream_buffer::next_token(buf);
        *(size_t *)((long)(buf->buffer_ptr)._M_elems + lVar17 + -8) = sVar25._M_len;
        *(char **)((long)&(buf->buffer_ptr)._M_elems[0]._M_len + lVar17) = sVar25._M_str;
        lVar17 = lVar17 + 0x10;
      } while (lVar17 != 0xa8);
    }
    psVar1 = (buf->buffer_ptr)._M_elems + 2;
    local_50 = psVar1->_M_len;
    pcStack_48 = (buf->buffer_ptr)._M_elems[2]._M_str;
    buf_1_01._M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
    buf_1_01._M_str = (buf->buffer_ptr)._M_elems[0]._M_str;
    read_function_element
              ((optional<function_element_token> *)&local_108._M_value,buf_1_01,
               (buf->buffer_ptr)._M_elems[1],*psVar1);
    if ((char)sStack_e8 == '\x01') {
      value_03._M_str = local_108._M_value.name._M_str;
      value_03._M_len = local_108._M_value.name._M_len;
      local_138._0_4_ = problem_parser::get_or_assign_variable(ppVar14,value_03);
      if (local_138._0_4_ != -1) {
        uVar16 = (long)local_178._M_value.max - local_178._0_8_;
        uVar13 = local_178._M_value.min;
        if (0 < (long)uVar16 >> 5) {
          lVar17 = ((long)uVar16 >> 5) + 1;
          uVar13 = (uVar16 & 0xffffffffffffffe0) + (long)local_178._M_value.min;
          uVar15 = (long)local_178._M_value.min + 0x10;
          do {
            if (*(int *)(uVar15 + -0xc) == local_138._0_4_) {
              uVar15 = (int *)(uVar15 + -0x10);
              goto LAB_00134e3b;
            }
            if (*(int *)(uVar15 + -4) == local_138._0_4_) {
              uVar15 = (int *)(uVar15 + -8);
              goto LAB_00134e3b;
            }
            if (*(int *)(uVar15 + 4) == local_138._0_4_) goto LAB_00134e3b;
            if (*(int *)(uVar15 + 0xc) == local_138._0_4_) {
              uVar15 = (int *)(uVar15 + 8);
              goto LAB_00134e3b;
            }
            lVar17 = lVar17 + -1;
            uVar15 = uVar15 + 0x20;
          } while (1 < lVar17);
          uVar16 = (long)local_178._M_value.max - uVar13;
        }
        lVar17 = (long)uVar16 >> 3;
        if (lVar17 == 1) {
LAB_00134e1f:
          uVar15 = uVar13;
          if (*(int *)(uVar13 + 4) != local_138._0_4_) {
            uVar15 = local_178._M_value.max;
          }
LAB_00134e3b:
          if ((double)uVar15 == local_178._M_value.max) goto LAB_00134e4d;
          *(int *)uVar15 = *(int *)uVar15 + (int)local_108._M_value.factor;
        }
        else {
          if (lVar17 == 2) {
LAB_00134e16:
            uVar15 = uVar13;
            if (*(int *)(uVar13 + 4) != local_138._0_4_) {
              uVar13 = uVar13 + 8;
              goto LAB_00134e1f;
            }
            goto LAB_00134e3b;
          }
          if (lVar17 == 3) {
            uVar15 = uVar13;
            if (*(int *)(uVar13 + 4) != local_138._0_4_) {
              uVar13 = uVar13 + 8;
              goto LAB_00134e16;
            }
            goto LAB_00134e3b;
          }
LAB_00134e4d:
          local_1f4 = (int)local_108._M_value.factor;
          std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>::
          emplace_back<int,int&>
                    ((vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>
                      *)&local_178._M_value,&local_1f4,(int *)&local_138);
        }
        stream_buffer::pop_front(buf,local_108._M_value.read);
        while( true ) {
          buf_1_03._M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
          buf_1_03._M_str = (buf->buffer_ptr)._M_elems[0]._M_str;
          buf_1_02._M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
          buf_1_02._M_str = (buf->buffer_ptr)._M_elems[0]._M_str;
          if (((buf->buffer_ptr)._M_elems[0]._M_len == 0) ||
             ((byte)(*(buf->buffer_ptr)._M_elems[0]._M_str - 0x3cU) < 3)) break;
          psVar1 = (buf->buffer_ptr)._M_elems + 2;
          local_60 = psVar1->_M_len;
          pcStack_58 = (buf->buffer_ptr)._M_elems[2]._M_str;
          read_function_element
                    ((optional<function_element_token> *)&local_108._M_value,buf_1_02,
                     (buf->buffer_ptr)._M_elems[1],*psVar1);
          if ((char)sStack_e8 != '\x01') {
            uVar19 = 10;
            goto LAB_00135013;
          }
          value_04._M_str = local_108._M_value.name._M_str;
          value_04._M_len = local_108._M_value.name._M_len;
          local_138._0_4_ = problem_parser::get_or_assign_variable(ppVar14,value_04);
          if (local_138._0_4_ == -1) goto LAB_00135004;
          uVar16 = (long)local_178._M_value.max - local_178._0_8_;
          uVar13 = local_178._M_value.min;
          if (0 < (long)uVar16 >> 5) {
            lVar17 = ((long)uVar16 >> 5) + 1;
            uVar13 = (uVar16 & 0xffffffffffffffe0) + (long)local_178._M_value.min;
            uVar15 = (long)local_178._M_value.min + 0x10;
            do {
              if (*(int *)(uVar15 + -0xc) == local_138._0_4_) {
                uVar15 = (int *)(uVar15 + -0x10);
                goto LAB_00134fa9;
              }
              if (*(int *)(uVar15 + -4) == local_138._0_4_) {
                uVar15 = (int *)(uVar15 + -8);
                goto LAB_00134fa9;
              }
              if (*(int *)(uVar15 + 4) == local_138._0_4_) goto LAB_00134fa9;
              if (*(int *)(uVar15 + 0xc) == local_138._0_4_) {
                uVar15 = (int *)(uVar15 + 8);
                goto LAB_00134fa9;
              }
              lVar17 = lVar17 + -1;
              uVar15 = uVar15 + 0x20;
            } while (1 < lVar17);
            uVar16 = (long)local_178._M_value.max - uVar13;
          }
          lVar17 = (long)uVar16 >> 3;
          if (lVar17 == 1) {
LAB_00134f8d:
            uVar15 = uVar13;
            if (*(int *)(uVar13 + 4) != local_138._0_4_) {
              uVar15 = local_178._M_value.max;
            }
LAB_00134fa9:
            if ((double)uVar15 == local_178._M_value.max) goto LAB_00134fbb;
            *(int *)uVar15 = *(int *)uVar15 + (int)local_108._M_value.factor;
          }
          else {
            if (lVar17 == 2) {
LAB_00134f84:
              uVar15 = uVar13;
              if (*(int *)(uVar13 + 4) != local_138._0_4_) {
                uVar13 = uVar13 + 8;
                goto LAB_00134f8d;
              }
              goto LAB_00134fa9;
            }
            if (lVar17 == 3) {
              uVar15 = uVar13;
              if (*(int *)(uVar13 + 4) != local_138._0_4_) {
                uVar13 = uVar13 + 8;
                goto LAB_00134f84;
              }
              goto LAB_00134fa9;
            }
LAB_00134fbb:
            local_1f4 = (int)local_108._M_value.factor;
            std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>::
            emplace_back<int,int&>
                      ((vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>
                        *)&local_178._M_value,&local_1f4,(int *)&local_138);
          }
          if (*(int *)((long)local_178._M_value.max + -4) == -1) goto LAB_00135004;
          stream_buffer::pop_front(buf,local_108._M_value.read);
        }
        oVar23 = read_operator(buf_1_03,(buf->buffer_ptr)._M_elems[1]);
        if (((undefined1  [12])
             oVar23.super__Optional_base<operator_token,_true,_true>._M_payload.
             super__Optional_payload_base<operator_token> & (undefined1  [12])0x1) ==
            (undefined1  [12])0x0) goto LAB_001350ee;
        stream_buffer::pop_front
                  (buf,oVar23.super__Optional_base<operator_token,_true,_true>._M_payload.
                       super__Optional_payload_base<operator_token>._M_payload._4_4_);
        buf_1_04._M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
        buf_1_04._M_str = (buf->buffer_ptr)._M_elems[0]._M_str;
        read_real((optional<real_token> *)&local_138._M_value,buf_1_04,(buf->buffer_ptr)._M_elems[1]
                 );
        cVar18 = local_128;
        if (local_128 == '\x01') {
          local_1f4 = (int)(double)CONCAT44(local_138._4_4_,local_138._0_4_);
          stream_buffer::pop_front(buf,local_138._M_value.read);
          iVar10 = oVar23.super__Optional_base<operator_token,_true,_true>._M_payload.
                   super__Optional_payload_base<operator_token>._M_payload._0_4_;
          if (iVar10 == 2) {
            local_1ec = local_1f0;
            std::vector<baryonyx::constraint,std::allocator<baryonyx::constraint>>::
            emplace_back<std::basic_string_view<char,std::char_traits<char>>&,std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>,int&,int>
                      (local_110,&local_148,
                       (vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                        *)&local_178._M_value,&local_1f4,&local_1ec);
          }
          else if (iVar10 == 1) {
            local_1ec = local_1f0;
            std::vector<baryonyx::constraint,std::allocator<baryonyx::constraint>>::
            emplace_back<std::basic_string_view<char,std::char_traits<char>>&,std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>,int&,int>
                      (local_118,&local_148,
                       (vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                        *)&local_178._M_value,&local_1f4,&local_1ec);
          }
          else {
            if (iVar10 != 0) goto LAB_00135105;
            local_1ec = local_1f0;
            std::vector<baryonyx::constraint,std::allocator<baryonyx::constraint>>::
            emplace_back<std::basic_string_view<char,std::char_traits<char>>&,std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>,int&,int>
                      (local_120,&local_148,
                       (vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                        *)&local_178._M_value,&local_1f4,&local_1ec);
          }
          local_1f0 = local_1f0 + 1;
          goto LAB_00135105;
        }
        goto LAB_001350fd;
      }
LAB_00135004:
      uVar19 = 0xb;
LAB_00135013:
      local_1e8 = 0.0;
      local_1f8 = 0;
      cVar18 = '\0';
    }
    else {
LAB_001350ee:
      cVar18 = '\0';
LAB_001350fd:
      local_1e8 = 0.0;
      uVar19 = 10;
      local_1f8 = 0;
    }
LAB_00135105:
    rVar22.column = local_1f8;
    rVar22.tag = (int)uVar19;
    rVar22.line = (int)(uVar19 >> 0x20);
    if ((void *)local_178._M_value.min != (void *)0x0) {
      operator_delete((void *)local_178._M_value.min,
                      local_178._M_value.name._M_len - local_178._0_8_);
    }
  } while (cVar18 != '\0');
  goto LAB_00135688;
LAB_001354cf:
  local_1e8 = 0.0;
  uVar19 = 8;
  goto LAB_00135680;
LAB_00135658:
  local_1e8 = 0.0;
  uVar19 = 4;
  goto LAB_00135680;
LAB_00135669:
  local_1e8 = 0.0;
  uVar19 = 3;
  goto LAB_00135680;
LAB_00135246:
  buf_1_05._M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
  buf_1_05._M_str = (buf->buffer_ptr)._M_elems[0]._M_str;
  iVar10 = read_bounds(buf_1_05,(buf->buffer_ptr)._M_elems[1]);
  if (iVar10 != 0) {
    stream_buffer::pop_front(buf,iVar10);
    do {
      rhs_00._M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
      rhs_00._M_str = (buf->buffer_ptr)._M_elems[0]._M_str;
      lVar17 = 8;
      do {
        bVar9 = are_equal(*(string_view *)((long)&PTR_typeinfo_0079c9d8 + lVar17),rhs_00);
        ppVar14 = local_180;
        if (bVar9) break;
        bVar20 = lVar17 != 0xd8;
        lVar17 = lVar17 + 0x10;
      } while (bVar20);
      if (bVar9) break;
      local_108._M_value.factor = (double)(buf->buffer_ptr)._M_elems[0]._M_len;
      local_108._M_value.name._M_len = (size_t)(buf->buffer_ptr)._M_elems[0]._M_str;
      local_108._M_value.name._M_str = (char *)(buf->buffer_ptr)._M_elems[1]._M_len;
      local_108._24_8_ = (buf->buffer_ptr)._M_elems[1]._M_str;
      sStack_e8 = (buf->buffer_ptr)._M_elems[2]._M_len;
      pcStack_e0 = (buf->buffer_ptr)._M_elems[2]._M_str;
      sStack_d8 = (buf->buffer_ptr)._M_elems[3]._M_len;
      pcStack_d0 = (buf->buffer_ptr)._M_elems[3]._M_str;
      sStack_c8 = (buf->buffer_ptr)._M_elems[4]._M_len;
      pcStack_c0 = (buf->buffer_ptr)._M_elems[4]._M_str;
      sStack_b8 = (buf->buffer_ptr)._M_elems[5]._M_len;
      pcStack_b0 = (buf->buffer_ptr)._M_elems[5]._M_str;
      local_a8 = (buf->buffer_ptr)._M_elems[6]._M_len;
      pcStack_a0 = (buf->buffer_ptr)._M_elems[6]._M_str;
      sStack_98 = (buf->buffer_ptr)._M_elems[7]._M_len;
      pcStack_90 = (buf->buffer_ptr)._M_elems[7]._M_str;
      sStack_88 = (buf->buffer_ptr)._M_elems[8]._M_len;
      pcStack_80 = (buf->buffer_ptr)._M_elems[8]._M_str;
      sStack_78 = (buf->buffer_ptr)._M_elems[9]._M_len;
      pcStack_70 = (buf->buffer_ptr)._M_elems[9]._M_str;
      read_bound((optional<bound_token> *)&local_178._M_value,
                 (string_view_array *)&local_108._M_value);
      if (local_150 != '\x01') goto LAB_001354cf;
      value_02._M_str = local_178._M_value.name._M_str;
      value_02._M_len = local_178._M_value.name._M_len;
      local_1e8 = local_178._M_value.min;
      dStack_1e0 = local_178._M_value.max;
      uVar11 = problem_parser::get_variable(ppVar14,value_02);
      if ((int)uVar11 < 0) goto LAB_001354cf;
      auVar21._8_8_ = dStack_1e0;
      auVar21._0_8_ = local_1e8;
      uVar19 = vcmppd_avx512vl(auVar21,_DAT_00625100,0);
      auVar21 = vmovdqa32_avx512vl(_DAT_00625110);
      bVar9 = (bool)((byte)(uVar19 & 3) & 1);
      bVar20 = SUB81((uVar19 & 3) >> 1,0);
      pvVar5 = (ppVar14->m_problem).vars.values.
               super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar11;
      pvVar5->min = (uint)bVar9 * auVar21._0_4_ | (uint)!bVar9 * (int)local_1e8;
      pvVar5->max = (uint)bVar20 * auVar21._4_4_ | (uint)!bVar20 * (int)dStack_1e0;
      stream_buffer::pop_front(buf,local_178._M_value.read);
    } while( true );
  }
  buf_1_06._M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
  buf_1_06._M_str = (buf->buffer_ptr)._M_elems[0]._M_str;
  iVar10 = read_binary(buf_1_06,(buf->buffer_ptr)._M_elems[1]);
  if (iVar10 != 0) {
    stream_buffer::pop_front(buf,iVar10);
    do {
      rhs_01._M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
      rhs_01._M_str = (buf->buffer_ptr)._M_elems[0]._M_str;
      lVar17 = 8;
      do {
        bVar9 = are_equal(*(string_view *)((long)&PTR_typeinfo_0079c9d8 + lVar17),rhs_01);
        ppVar14 = local_180;
        if (bVar9) break;
        bVar20 = lVar17 != 0xd8;
        lVar17 = lVar17 + 0x10;
      } while (bVar20);
      if (bVar9) break;
      value_00._M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
      value_00._M_str = (buf->buffer_ptr)._M_elems[0]._M_str;
      uVar11 = problem_parser::get_variable(local_180,value_00);
      if ((int)uVar11 < 0) goto LAB_00135658;
      pvVar5 = (ppVar14->m_problem).vars.values.
               super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar5[uVar11].type = binary;
      pvVar5 = pvVar5 + uVar11;
      pvVar5->min = 0;
      pvVar5->max = 1;
      local_108._M_value.factor = (double)(buf->buffer_ptr)._M_elems[0]._M_len;
      local_108._M_value.name._M_len = (size_t)(buf->buffer_ptr)._M_elems[0]._M_str;
      pcVar3 = local_190->_M_str;
      (buf->buffer_ptr)._M_elems[0]._M_len = local_190->_M_len;
      (buf->buffer_ptr)._M_elems[0]._M_str = pcVar3;
      pcVar3 = local_198->_M_str;
      local_190->_M_len = local_198->_M_len;
      local_190->_M_str = pcVar3;
      pcVar3 = local_1a0->_M_str;
      local_198->_M_len = local_1a0->_M_len;
      local_198->_M_str = pcVar3;
      pcVar3 = local_1a8->_M_str;
      local_1a0->_M_len = local_1a8->_M_len;
      local_1a0->_M_str = pcVar3;
      pcVar3 = local_1b0->_M_str;
      local_1a8->_M_len = local_1b0->_M_len;
      local_1a8->_M_str = pcVar3;
      pcVar3 = local_1b8->_M_str;
      local_1b0->_M_len = local_1b8->_M_len;
      local_1b0->_M_str = pcVar3;
      pcVar3 = local_1c0->_M_str;
      local_1b8->_M_len = local_1c0->_M_len;
      local_1b8->_M_str = pcVar3;
      pcVar3 = local_1c8->_M_str;
      local_1c0->_M_len = local_1c8->_M_len;
      local_1c0->_M_str = pcVar3;
      pcVar3 = local_1d0->_M_str;
      local_1c8->_M_len = local_1d0->_M_len;
      local_1c8->_M_str = pcVar3;
      local_1d0->_M_len = (size_t)local_108._M_value.factor;
      local_1d0->_M_str = (char *)local_108._M_value.name._M_len;
      sVar25 = stream_buffer::next_token(buf);
      (buf->buffer_ptr)._M_elems[9] = sVar25;
    } while( true );
  }
  buf_1_07._M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
  buf_1_07._M_str = (buf->buffer_ptr)._M_elems[0]._M_str;
  iVar10 = read_general(buf_1_07,(buf->buffer_ptr)._M_elems[1]);
  if (iVar10 != 0) {
    stream_buffer::pop_front(buf,iVar10);
    do {
      rhs_02._M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
      rhs_02._M_str = (buf->buffer_ptr)._M_elems[0]._M_str;
      lVar17 = 8;
      do {
        bVar9 = are_equal(*(string_view *)((long)&PTR_typeinfo_0079c9d8 + lVar17),rhs_02);
        if (bVar9) break;
        bVar20 = lVar17 != 0xd8;
        lVar17 = lVar17 + 0x10;
      } while (bVar20);
      if (bVar9) break;
      value_01._M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
      value_01._M_str = (buf->buffer_ptr)._M_elems[0]._M_str;
      uVar11 = problem_parser::get_variable(ppVar14,value_01);
      if ((int)uVar11 < 0) goto LAB_00135669;
      (ppVar14->m_problem).vars.values.
      super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar11].type = general;
      local_108._M_value.factor = (double)(buf->buffer_ptr)._M_elems[0]._M_len;
      local_108._M_value.name._M_len = (size_t)(buf->buffer_ptr)._M_elems[0]._M_str;
      pcVar3 = local_190->_M_str;
      (buf->buffer_ptr)._M_elems[0]._M_len = local_190->_M_len;
      (buf->buffer_ptr)._M_elems[0]._M_str = pcVar3;
      pcVar3 = local_198->_M_str;
      local_190->_M_len = local_198->_M_len;
      local_190->_M_str = pcVar3;
      pcVar3 = local_1a0->_M_str;
      local_198->_M_len = local_1a0->_M_len;
      local_198->_M_str = pcVar3;
      pcVar3 = local_1a8->_M_str;
      local_1a0->_M_len = local_1a8->_M_len;
      local_1a0->_M_str = pcVar3;
      pcVar3 = local_1b0->_M_str;
      local_1a8->_M_len = local_1b0->_M_len;
      local_1a8->_M_str = pcVar3;
      pcVar3 = local_1b8->_M_str;
      local_1b0->_M_len = local_1b8->_M_len;
      local_1b0->_M_str = pcVar3;
      pcVar3 = local_1c0->_M_str;
      local_1b8->_M_len = local_1c0->_M_len;
      local_1b8->_M_str = pcVar3;
      pcVar3 = local_1c8->_M_str;
      local_1c0->_M_len = local_1c8->_M_len;
      local_1c0->_M_str = pcVar3;
      pcVar3 = local_1d0->_M_str;
      local_1c8->_M_len = local_1d0->_M_len;
      local_1c8->_M_str = pcVar3;
      local_1d0->_M_len = (size_t)local_108._M_value.factor;
      local_1d0->_M_str = (char *)local_108._M_value.name._M_len;
      sVar25 = stream_buffer::next_token(buf);
      (buf->buffer_ptr)._M_elems[9] = sVar25;
    } while( true );
  }
  buf_1_08._M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
  buf_1_08._M_str = (buf->buffer_ptr)._M_elems[0]._M_str;
  iVar10 = read_end(buf_1_08,(buf->buffer_ptr)._M_elems[1]);
  local_1e8 = 0.0;
  if (iVar10 == 0) {
    uVar19 = 9;
  }
  else {
    stream_buffer::pop_front(buf,iVar10);
    uVar19 = (ulong)((uint)((buf->buffer_ptr)._M_elems[0]._M_len != 0) * 2);
  }
LAB_00135680:
  rVar22.column = 0;
  rVar22.tag = (int)uVar19;
  rVar22.line = (int)(uVar19 >> 0x20);
LAB_00135688:
  local_1f8 = rVar22.column;
  rVar24._0_8_ = rVar22._0_8_ & 0xffffffff | (long)local_1e8 << 0x20;
  rVar24.column = local_1f8;
  return rVar24;
}

Assistant:

raw_problem_status
parse([[maybe_unused]] const baryonyx::context& ctx,
      stream_buffer& buf,
      problem_parser& p) noexcept
{
    if (auto obj_type = read_objective_type(buf.first()); !obj_type)
        return baryonyx::file_format_error_tag::bad_objective_function_type;
    else
        p.m_problem.type = *obj_type;

    buf.pop_front();

    if (auto read = try_read_objective_label(buf.first(), buf.second()); read)
        buf.pop_front(read);

    while (!is_keyword(buf.first())) {
        if (starts_with_quadratic(buf.first(), buf.second())) {
            double factor = 1.0;

            if (buf.first() == "-") {
                factor = -1.0;
                buf.pop_front();
            } else if (buf.first() == "+") {
                buf.pop_front();
            }

            if (auto ret = read_quadratic_element(buf, p, factor); !ret)
                return ret;
            continue;
        }

        if (auto elem =
              read_function_element(buf.first(), buf.second(), buf.third());
            elem) {
            if (!p.append_to_objective(*elem))
                return baryonyx::file_format_error_tag::too_many_variables;

            buf.pop_front(elem->read);
            continue;
        }

        return baryonyx::file_format_error_tag::bad_objective;
    }

    if (auto read = read_subject_to(buf.first(), buf.second(), buf.third());
        read) {
        buf.pop_front(read);
        int constraint_next_id = 0;

        while (!buf.first().empty() && !is_keyword(buf.first())) {
            std::string_view label;
            int value;
            std::vector<baryonyx::function_element> elements;

            if (starts_with_name(buf.first()) && buf.second() == ":") {
                label = p.m_problem.strings->append(buf.first());
                buf.pop_front(2);
            }

            auto elem =
              read_function_element(buf.first(), buf.second(), buf.third());
            if (!elem)
                return baryonyx::file_format_error_tag::bad_constraint;

            {
                auto id = p.get_or_assign_variable(elem->name);
                if (id == -1)
                    return baryonyx::file_format_error_tag::too_many_variables;

                auto it = std::find_if(
                  elements.begin(), elements.end(), [id](const auto& elem) {
                      return elem.variable_index == id;
                  });

                if (it == elements.end())
                    elements.emplace_back(static_cast<int>(elem->factor), id);
                else
                    it->factor += static_cast<int>(elem->factor);
            }

            buf.pop_front(elem->read);

            while (!buf.first().empty() &&
                   !starts_with_operator(buf.first())) {
                elem = read_function_element(
                  buf.first(), buf.second(), buf.third());
                if (!elem)
                    return baryonyx::file_format_error_tag::bad_constraint;

                {
                    auto id = p.get_or_assign_variable(elem->name);
                    if (id == -1)
                        return baryonyx::file_format_error_tag::
                          too_many_variables;

                    auto it =
                      std::find_if(elements.begin(),
                                   elements.end(),
                                   [id](const auto& elem) {
                                       return elem.variable_index == id;
                                   });

                    if (it == elements.end())
                        elements.emplace_back(static_cast<int>(elem->factor),
                                              id);
                    else
                        it->factor += static_cast<int>(elem->factor);
                }

                if (elements.back().variable_index == -1)
                    return baryonyx::file_format_error_tag::too_many_variables;

                buf.pop_front(elem->read);
            }

            auto operator_opt = read_operator(buf.first(), buf.second());
            if (!operator_opt)
                return baryonyx::file_format_error_tag::bad_constraint;
            buf.pop_front(operator_opt->read);

            auto value_opt = read_real(buf.first(), buf.second());
            if (!value_opt)
                return baryonyx::file_format_error_tag::bad_constraint;
            value = static_cast<int>(value_opt->value);
            buf.pop_front(value_opt->read);

            switch (operator_opt->op) {
            case baryonyx::operator_type::equal:
                p.m_problem.equal_constraints.emplace_back(
                  label, std::move(elements), value, constraint_next_id++);
                break;
            case baryonyx::operator_type::greater:
                p.m_problem.greater_constraints.emplace_back(
                  label, std::move(elements), value, constraint_next_id++);
                break;
            case baryonyx::operator_type::less:
                p.m_problem.less_constraints.emplace_back(
                  label, std::move(elements), value, constraint_next_id++);
                break;
            }
        }

        if (p.m_problem.equal_constraints.size() +
              p.m_problem.greater_constraints.size() +
              p.m_problem.less_constraints.size() >
            baryonyx::to_unsigned(INT_MAX))
            return baryonyx::file_format_error_tag::too_many_constraints;
    }

    if (auto read = read_bounds(buf.first(), buf.second()); read) {
        buf.pop_front(read);

        while (!is_keyword(buf.first())) {
            auto bound_opt = read_bound(buf.array());
            if (!bound_opt)
                return baryonyx::file_format_error_tag::bad_bound;

            if (!p.set_bound_variable(*bound_opt))
                return baryonyx::file_format_error_tag::bad_bound;

            buf.pop_front(bound_opt->read);
        }
    }

    if (auto read = read_binary(buf.first(), buf.second()); read) {
        buf.pop_front(read);

        while (!is_keyword(buf.first()))
            if (!p.set_boolean_variable(buf.first()))
                return baryonyx::file_format_error_tag::bad_binary;
            else
                buf.pop_front();
    }

    if (auto read = read_general(buf.first(), buf.second()); read) {
        buf.pop_front(read);

        while (!is_keyword(buf.first()))
            if (!p.set_integer_variable(buf.first()))
                return baryonyx::file_format_error_tag::bad_general;
            else
                buf.pop_front();
    }

    if (auto read = read_end(buf.first(), buf.second()); read) {
        buf.pop_front(read);

        return buf.first().empty()
                 ? baryonyx::file_format_error_tag::success
                 : baryonyx::file_format_error_tag::bad_end_of_file;
    }

    return baryonyx::file_format_error_tag::bad_end;
}